

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O2

bool __thiscall Triangle::intersect(Triangle *this,Ray *ray,Hit *hit,float tmin)

{
  undefined1 *v0;
  int iVar1;
  float *pfVar2;
  Vector3f *this_00;
  float fVar3;
  float fVar4;
  bool sg;
  Vector3f R;
  Vector3f local_c0;
  Vector3f tmp;
  Vector3f local_9c;
  Vector3f p;
  Vector3f local_6c;
  Vector3f local_60;
  Matrix3f L;
  
  if (this->empty != false) {
    return false;
  }
  v0 = &this->field_0x74;
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x5c);
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x68);
  Matrix3f::Matrix3f(&L,&ray->d,&p,&R,true);
  operator-((Vector3f *)v0,&ray->o);
  Matrix3f::inverse((Matrix3f *)&p,&L,&sg,0.0);
  Matrix3f::operator=(&L,(Matrix3f *)&p);
  if (sg != false) {
    return false;
  }
  ::operator*((Matrix3f *)&p,(Vector3f *)&L);
  Vector3f::operator=(&R,&p);
  pfVar2 = Vector3f::operator[](&R,1);
  fVar3 = *pfVar2;
  pfVar2 = Vector3f::operator[](&R,2);
  if (1.0 < fVar3 + *pfVar2) {
    return false;
  }
  pfVar2 = Vector3f::operator[](&R,1);
  if (*pfVar2 < 0.0) {
    return false;
  }
  pfVar2 = Vector3f::operator[](&R,2);
  if (*pfVar2 < 0.0) {
    return false;
  }
  pfVar2 = Vector3f::operator[](&R,0);
  fVar3 = *pfVar2;
  if (fVar3 < tmin) {
    return false;
  }
  if (hit->t <= fVar3) {
    return false;
  }
  hit->t = fVar3;
  hit->obj = &this->super_Object;
  if (this->use_n == true) {
    pfVar2 = Vector3f::operator[](&R,1);
    ::operator*(*pfVar2,&local_9c);
    pfVar2 = Vector3f::operator[](&R,2);
    ::operator*(*pfVar2,&local_6c);
    operator+(&local_9c,&local_6c);
    pfVar2 = Vector3f::operator[](&R,1);
    fVar4 = *pfVar2;
    pfVar2 = Vector3f::operator[](&R,2);
    ::operator*((1.0 - fVar4) - *pfVar2,&local_60);
    operator+(&local_c0,&local_60);
    Vector3f::normalized(&tmp);
  }
  else {
    Vector3f::Vector3f(&p,(Vector3f *)&this->field_0x38);
  }
  Vector3f::operator=(&hit->norm,&p);
  iVar1 = (*((this->super_Object).m)->_vptr_Material[2])();
  if ((char)iVar1 == '\0') {
    this_00 = &p;
    fVar3 = 0.0;
    fVar4 = 0.0;
  }
  else {
    if (this->has_uv != false) {
      pfVar2 = Vector3f::operator[](&R,1);
      ::operator*((Vector2f *)&local_c0,*pfVar2);
      pfVar2 = Vector3f::operator[](&R,2);
      ::operator*((Vector2f *)&local_9c,*pfVar2);
      operator+((Vector2f *)&local_c0,(Vector2f *)&local_9c);
      pfVar2 = Vector3f::operator[](&R,1);
      fVar3 = *pfVar2;
      pfVar2 = Vector3f::operator[](&R,2);
      ::operator*((Vector2f *)&local_6c,(1.0 - fVar3) - *pfVar2);
      this_00 = &p;
      operator+((Vector2f *)&tmp,(Vector2f *)&local_6c);
      goto LAB_001d602e;
    }
    ::operator*(&local_9c,fVar3);
    operator+(&ray->o,&local_9c);
    operator-(&local_c0,&this->o);
    ::operator*((Matrix3f *)&p,(Vector3f *)&this->matrix);
    ::operator*(&local_c0,fVar3);
    operator+(&ray->o,&local_c0);
    pfVar2 = Vector3f::operator[](&p,1);
    fVar3 = *pfVar2;
    pfVar2 = Vector3f::operator[](&p,2);
    fVar4 = *pfVar2;
    this_00 = &local_c0;
  }
  Vector2f::Vector2f((Vector2f *)this_00,fVar3,fVar4);
LAB_001d602e:
  Vector2f::operator=(&hit->pos,(Vector2f *)this_00);
  return true;
}

Assistant:

bool intersect(const Ray& ray, Hit& hit, float tmin) override {
		if (empty) return 0;
		Matrix3f L(ray.d, v[2] - v[0], v[2] - v[1], 1);
		Vector3f R = v[2] - ray.o;
		bool sg; L = L.inverse(&sg);
		if (sg) return 0; R = L * R;
		if (R[1] + R[2] > 1 || R[1] < 0 || R[2] < 0) return 0;
		float t = R[0];
		if (t < tmin || t >= hit.t) return 0;
		hit.t = t; hit.obj = this;
		hit.norm = use_n?((R[1]*n[0]+R[2]*n[1]+(1-R[1]-R[2])*n[2]).normalized()):n[0];
		if (m->need_coords()) {
			if (!has_uv) {
				Vector3f p = matrix * (ray.o + ray.d * t - o);
				Vector3f tmp = ray.o + ray.d * t;
	//			cerr << tmp[0] << "," << tmp[1] << "," << tmp[2] << ":" << p[1] << "," << p[2] << "\n";
				hit.pos = Vector2f(p[1], p[2]);
			}
			else {
				hit.pos = uv[0] * R[1] + uv[1] * R[2] + uv[2] * (1 - R[1] - R[2]);
			}
		}
		else hit.pos = Vector2f(0, 0);
		return 1;
	}